

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomvar.cpp
# Opt level: O0

unique_ptr<MetaSim::NormalVar,_std::default_delete<MetaSim::NormalVar>_>
MetaSim::NormalVar::createInstance
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *par)

{
  size_type sVar1;
  undefined8 uVar2;
  char *pcVar3;
  unique_ptr<MetaSim::NormalVar,_std::default_delete<MetaSim::NormalVar>_> *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  __uniq_ptr_data<MetaSim::NormalVar,_std::default_delete<MetaSim::NormalVar>,_true,_true> in_RDI;
  double b;
  double a;
  string *in_stack_00000130;
  string *in_stack_00000138;
  ParseExc *in_stack_00000140;
  pointer in_stack_ffffffffffffff48;
  double in_stack_ffffffffffffff58;
  allocator *paVar4;
  NormalVar *in_stack_ffffffffffffff60;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  double local_20;
  double local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_10 = in_RSI;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RSI);
  if (sVar1 != 2) {
    uVar2 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Wrong number of parameters",&local_41);
    paVar4 = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"NormalVar",paVar4);
    parse_util::ParseExc::ParseExc(in_stack_00000140,in_stack_00000138,in_stack_00000130);
    __cxa_throw(uVar2,&parse_util::ParseExc::typeinfo,parse_util::ParseExc::~ParseExc);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_10,0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  local_18 = atof(pcVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_10,1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  local_20 = atof(pcVar3);
  this = (unique_ptr<MetaSim::NormalVar,_std::default_delete<MetaSim::NormalVar>_> *)
         operator_new(0x40);
  NormalVar(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(double)this);
  std::unique_ptr<MetaSim::NormalVar,std::default_delete<MetaSim::NormalVar>>::
  unique_ptr<std::default_delete<MetaSim::NormalVar>,void>(this,in_stack_ffffffffffffff48);
  return (__uniq_ptr_data<MetaSim::NormalVar,_std::default_delete<MetaSim::NormalVar>,_true,_true>)
         (tuple<MetaSim::NormalVar_*,_std::default_delete<MetaSim::NormalVar>_>)
         in_RDI.super___uniq_ptr_impl<MetaSim::NormalVar,_std::default_delete<MetaSim::NormalVar>_>.
         _M_t.super__Tuple_impl<0UL,_MetaSim::NormalVar_*,_std::default_delete<MetaSim::NormalVar>_>
         .super__Head_base<0UL,_MetaSim::NormalVar_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<NormalVar> NormalVar::createInstance(vector<string> &par) 
    {
        double a,b;

        if (par.size() != 2) 
            throw ParseExc("Wrong number of parameters", "NormalVar");

        a = atof(par[0].c_str());
        b = atof(par[1].c_str());
        return unique_ptr<NormalVar>(new NormalVar(a,b));
    }